

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FrameworkIntegrations.cpp
# Opt level: O3

void ApprovalTests::FrameworkIntegrations::setTestPassedNotification
               (TestPassedNotification *notification)

{
  _Any_data _Stack_28;
  _Manager_type local_18;
  
  ::std::function<void_()>::function((function<void_()> *)&_Stack_28,notification);
  FileApprover::setTestPassedNotification((TestPassedNotification *)&_Stack_28);
  if (local_18 != (code *)0x0) {
    (*local_18)(&_Stack_28,&_Stack_28,__destroy_functor);
  }
  return;
}

Assistant:

void FrameworkIntegrations::setTestPassedNotification(
        FileApprover::TestPassedNotification notification)
    {
        FileApprover::setTestPassedNotification(notification);
    }